

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiddle~.c
# Opt level: O2

t_int * fiddle_perform(t_int *w)

{
  int iVar1;
  int iVar2;
  int iVar3;
  t_sigfiddle *x;
  long lVar4;
  t_float *ptVar5;
  long lVar6;
  int iVar7;
  bool bVar8;
  
  x = (t_sigfiddle *)w[2];
  iVar1 = x->x_hop;
  if ((long)iVar1 != 0) {
    iVar2 = (int)w[3];
    lVar4 = w[1];
    iVar3 = x->x_phase;
    ptVar5 = x->x_inbuf;
    lVar6 = 0;
    iVar7 = 0;
    if (0 < iVar2) {
      iVar7 = iVar2;
    }
    while (bVar8 = iVar7 != 0, iVar7 = iVar7 + -1, bVar8) {
      *(undefined4 *)((long)ptVar5 + lVar6 + (long)iVar3 * 4) = *(undefined4 *)(lVar4 + lVar6);
      lVar6 = lVar6 + 4;
    }
    if ((long)iVar1 * 4 + (long)iVar3 * -4 == lVar6) {
      sigfiddle_doit(x);
      x->x_phase = 0;
      if (x->x_auto != 0) {
        clock_delay(x->x_clock,0.0);
      }
      if (x->x_nprint != 0) {
        x->x_nprint = x->x_nprint + -1;
      }
    }
    else {
      x->x_phase = iVar3 + iVar2;
    }
  }
  return w + 4;
}

Assistant:

static t_int *fiddle_perform(t_int *w)
{
    t_float *in = (t_float *)(w[1]);
    t_sigfiddle *x = (t_sigfiddle *)(w[2]);
    int n = (int)(w[3]);
    int count;
    t_float *fp;
    if (!x->x_hop)
        goto nono;
    for (count = 0, fp = x->x_inbuf + x->x_phase; count < n; count++)
        *fp++ = *in++;
    if (fp == x->x_inbuf + x->x_hop)
    {
        sigfiddle_doit(x);
        x->x_phase = 0;
        if (x->x_auto) clock_delay(x->x_clock, 0L);
        if (x->x_nprint) x->x_nprint--;
    }
    else x->x_phase += n;
nono:
    return (w+4);
}